

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O0

Sym_Man_t * Sym_ManStart(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  Sym_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Extra_BitMat_t *pEVar4;
  uint *puVar5;
  Vec_Vec_t *pVVar6;
  int local_28;
  int local_24;
  int v;
  int i;
  Sym_Man_t *p;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  __s = (Sym_Man_t *)malloc(0xf8);
  memset(__s,0,0xf8);
  __s->pNtk = pNtk;
  pVVar2 = Abc_NtkDfs(pNtk,0);
  __s->vNodes = pVVar2;
  iVar1 = Abc_NtkCiNum(__s->pNtk);
  __s->nInputs = iVar1;
  iVar1 = Abc_NtkCoNum(__s->pNtk);
  __s->nOutputs = iVar1;
  __s->nSimWords = (__s->nInputs >> 5) + (uint)((__s->nInputs & 0x1fU) != 0);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar2 = Sim_UtilInfoAlloc(iVar1,__s->nSimWords,0);
  __s->vSim = pVVar2;
  pVVar2 = Vec_PtrStart(__s->nOutputs);
  __s->vMatrSymms = pVVar2;
  pVVar2 = Vec_PtrStart(__s->nOutputs);
  __s->vMatrNonSymms = pVVar2;
  pVVar3 = Vec_IntStart(__s->nOutputs);
  __s->vPairsTotal = pVVar3;
  pVVar3 = Vec_IntStart(__s->nOutputs);
  __s->vPairsSym = pVVar3;
  pVVar3 = Vec_IntStart(__s->nOutputs);
  __s->vPairsNonSym = pVVar3;
  for (local_24 = 0; local_24 < __s->nOutputs; local_24 = local_24 + 1) {
    pEVar4 = Extra_BitMatrixStart(__s->nInputs);
    __s->vMatrSymms->pArray[local_24] = pEVar4;
    pEVar4 = Extra_BitMatrixStart(__s->nInputs);
    __s->vMatrNonSymms->pArray[local_24] = pEVar4;
  }
  puVar5 = (uint *)malloc((long)__s->nSimWords << 2);
  __s->uPatRand = puVar5;
  puVar5 = (uint *)malloc((long)__s->nSimWords << 2);
  __s->uPatCol = puVar5;
  puVar5 = (uint *)malloc((long)__s->nSimWords << 2);
  __s->uPatRow = puVar5;
  pVVar3 = Vec_IntStart(100);
  __s->vVarsU = pVVar3;
  pVVar3 = Vec_IntStart(100);
  __s->vVarsV = pVVar3;
  pVVar2 = Sim_ComputeFunSupp(pNtk,fVerbose);
  __s->vSuppFun = pVVar2;
  pVVar6 = Vec_VecStart(__s->nOutputs);
  __s->vSupports = pVVar6;
  for (local_24 = 0; local_24 < __s->nOutputs; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < __s->nInputs; local_28 = local_28 + 1) {
      if ((*(uint *)((long)__s->vSuppFun->pArray[local_24] + (long)(local_28 >> 5) * 4) &
          1 << ((byte)local_28 & 0x1f)) != 0) {
        Vec_VecPushInt(__s->vSupports,local_24,local_28);
      }
    }
  }
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the simulation manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sym_Man_t * Sym_ManStart( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    int i, v; 
    // start the manager
    p = ABC_ALLOC( Sym_Man_t, 1 );
    memset( p, 0, sizeof(Sym_Man_t) );
    p->pNtk = pNtk;
    p->vNodes     = Abc_NtkDfs( pNtk, 0 );
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimWords  = SIM_NUM_WORDS(p->nInputs);
    p->vSim       = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    // symmetry info for each output
    p->vMatrSymms    = Vec_PtrStart( p->nOutputs );
    p->vMatrNonSymms = Vec_PtrStart( p->nOutputs );
    p->vPairsTotal   = Vec_IntStart( p->nOutputs );
    p->vPairsSym     = Vec_IntStart( p->nOutputs );
    p->vPairsNonSym  = Vec_IntStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        p->vMatrSymms->pArray[i]    = Extra_BitMatrixStart( p->nInputs );
        p->vMatrNonSymms->pArray[i] = Extra_BitMatrixStart( p->nInputs );
    }
    // temporary patterns
    p->uPatRand = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatCol  = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatRow  = ABC_ALLOC( unsigned, p->nSimWords );
    p->vVarsU   = Vec_IntStart( 100 );
    p->vVarsV   = Vec_IntStart( 100 );
    // compute supports
    p->vSuppFun  = Sim_ComputeFunSupp( pNtk, fVerbose );
    p->vSupports = Vec_VecStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
        for ( v = 0; v < p->nInputs; v++ )
            if ( Sim_SuppFunHasVar( p->vSuppFun, i, v ) )
                Vec_VecPushInt( p->vSupports, i, v );
    return p;
}